

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rule.c
# Opt level: O3

Rule * Rule_new(Location_conflict location,IdGenerator *id_generator,wchar_t *keyword,wchar_t *name,
               wchar_t *description,Tags *tags,ChildDefinitions *child_definitions)

{
  Rule *pRVar1;
  wchar_t *pwVar2;
  
  pRVar1 = (Rule *)malloc(0x48);
  pRVar1->rule_delete = Rule_delete;
  pRVar1->type = Gherkin_Rule;
  (pRVar1->location).line = location.line;
  (pRVar1->location).column = location.column;
  pwVar2 = (*id_generator->new_id)(id_generator);
  pRVar1->id = pwVar2;
  if (keyword != (wchar_t *)0x0) {
    pwVar2 = StringUtilities_copy_string(keyword);
    pRVar1->keyword = pwVar2;
  }
  if (name != (wchar_t *)0x0) {
    pwVar2 = StringUtilities_copy_string(name);
    pRVar1->name = pwVar2;
  }
  pRVar1->description = description;
  pRVar1->tags = tags;
  pRVar1->child_definitions = child_definitions;
  return pRVar1;
}

Assistant:

const Rule* Rule_new(Location location, IdGenerator* id_generator, const wchar_t* keyword, const wchar_t* name, const wchar_t* description, const Tags* tags, const ChildDefinitions* child_definitions) {
    Rule* rule = (Rule*)malloc(sizeof(Rule));
    rule->rule_delete = (item_delete_function)Rule_delete;
    rule->type = Gherkin_Rule;
    rule->location.line = location.line;
    rule->location.column = location.column;
    rule->id = id_generator->new_id(id_generator);
    if (keyword) {
        rule->keyword = StringUtilities_copy_string(keyword);
    }
    if (name) {
        rule->name = StringUtilities_copy_string(name);
    }
    rule->description = description;
    rule->tags = tags;
    rule->child_definitions = child_definitions;
    return rule;
}